

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax-test.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 auVar4 [8];
  long lVar5;
  pointer pTVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_160 [8];
  TokenReader reader;
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  testCases;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<Token,_std::allocator<Token>_> local_48;
  
  local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_start = (Token *)0x0;
  local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Token *)0x0;
  local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_160 = (undefined1  [8])
              &reader.m_tokenList.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"int age = 40","");
  reader._24_8_ = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&reader.pos,"int arg, b = 23, a=3,c","")
  ;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"int a = 2 + 3 *5 + 8 + 9 *100","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"int a = 2 + ((3 +5)*9 + (9 - 2))","");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"int b = 2 + 3 +5","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"int ","");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"int","");
  __l._M_len = 7;
  __l._M_array = (iterator)local_160;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80,__l,
           (allocator_type *)
           &testCases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar5 = 0;
  do {
    if (local_90 + lVar5 != *(undefined1 **)((long)local_a0 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_a0 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0xe0);
  if (local_80 !=
      (undefined1  [8])
      testCases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar4 = local_80;
    do {
      grammar_analyze((string *)auVar4,(vector *)&local_48);
      for (pTVar6 = local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pTVar6 != local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_finish; pTVar6 = pTVar6 + 1) {
        type2str_abi_cxx11_((TokenType *)local_160);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_160,
                            (long)reader.m_tokenList.
                                  super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                  super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(pTVar6->val)._M_dataplus._M_p,(pTVar6->val)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_160 !=
            (undefined1  [8])
            &reader.m_tokenList.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete((void *)local_160);
        }
      }
      std::vector<Token,_std::allocator<Token>_>::vector
                ((vector<Token,_std::allocator<Token>_> *)local_160,&local_48);
      reader.m_tokenList.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      Singleton<SimpleSyntaxAnalyzer>::instance();
      SimpleSyntaxAnalyzer::analyze
                ((TokenReader *)
                 &testCases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (testCases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        SimpleASTNode::print
                  ((int)testCases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<Token,_std::allocator<Token>_>::_M_erase
                (&local_48,
                 (iterator)
                 local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (iterator)
                 local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      cVar1 = TokenReader::empty();
      pcVar3 = "TokenReader still has items\n";
      if (cVar1 != '\0') {
        pcVar3 = "TokenReader is empty\n";
      }
      lVar5 = 0x1c;
      if (cVar1 != '\0') {
        lVar5 = 0x15;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      std::vector<Token,_std::allocator<Token>_>::~vector
                ((vector<Token,_std::allocator<Token>_> *)local_160);
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      auVar4 = (undefined1  [8])((long)auVar4 + 0x20);
    } while (auVar4 != (undefined1  [8])
                       testCases.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_48);
  return 0;
}

Assistant:

int main(int, char**) {
    std::vector<Token> res = {};

    std::vector<std::string> testCases = {"int age = 40", "int arg, b = 23, a=3,c", "int a = 2 + 3 *5 + 8 + 9 *100", \
    "int a = 2 + ((3 +5)*9 + (9 - 2))", "int b = 2 + 3 +5", "int ", "int"};

    for (auto& item : testCases) {
        grammar_analyze(item, res);
        for (std::vector<Token>::iterator iter = res.begin(); iter != res.end(); iter++)
            std::cout << type2str(iter->type) << ": " << iter->val << std::endl;
        SimpleASTNode::Ptr node;
        TokenReader reader(res);
        try {
            node = SimpleSyntaxAnalyzer::instance()->analyze(reader);
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
            exit(1);
        }

        if (node != nullptr)
            node->print(0);
        res.erase(res.begin(), res.end());
        std::cout << (reader.empty() ? "TokenReader is empty\n" : "TokenReader still has items\n") << std::endl;
    }
    return 0;
}